

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O1

string * __thiscall
oout::XmlReportText::asString_abi_cxx11_(string *__return_storage_ptr__,XmlReportText *this)

{
  ostream *poVar1;
  FmtJunitXml format;
  ostringstream out;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  undefined **local_1a0;
  CountFailure local_198 [7];
  ios_base local_128 [264];
  
  CountFailure::CountFailure(local_198,&this->result);
  CountFailure::count(local_198);
  if (local_198[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198[0].result.
               super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"<?xml version=\'1.0\' encoding=\'UTF-8\'?>",0x26);
  std::ios::widen((char)(ostringstream *)local_198 +
                  (char)local_198[0].result.
                        super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        [-3]._vptr_Result);
  std::ostream::put((char)local_198);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"<testsuites ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"errors=\'",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"failures=\'",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'>",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_1a0 = &PTR__Format_00199bf0;
  (*((this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Result[2])(&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,(char *)local_1c0,local_1b8);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"</testsuites>",0xd);
  std::ios::widen((char)(ostream *)local_198 +
                  (char)local_198[0].result.
                        super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        [-3]._vptr_Result);
  std::ostream::put((char)local_198);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string XmlReportText::asString() const
{
	const auto failure_count = CountFailure(result).count();

	ostringstream out;
	out << "<?xml version='1.0' encoding='UTF-8'?>" << endl;
	out << "<testsuites "
	    << "errors='" << failure_count << "' "
	    << "failures='" << failure_count << "'>"
	    << endl;

	FmtJunitXml format;
	out << result->print(format);

	out << "</testsuites>" << endl;
	return out.str();
}